

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O0

int ffparsecompspec(fitsfile *fptr,char *compspec,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  int *piVar4;
  bool bVar5;
  double dVar6;
  float local_80;
  float local_7c;
  float scale;
  float qlevel;
  long tilesize [6];
  int local_40;
  int local_3c;
  int quantize_method;
  int smooth;
  int compresstype;
  int ii;
  char *ptr1;
  int *status_local;
  char *compspec_local;
  fitsfile *fptr_local;
  
  quantize_method = 0xb;
  local_3c = 0;
  local_40 = 1;
  ptr1 = (char *)status;
  status_local = (int *)compspec;
  compspec_local = (char *)fptr;
  memset(&scale,0,0x30);
  local_7c = -99.0;
  local_80 = 0.0;
  for (_compresstype = status_local; (char)*_compresstype == ' ';
      _compresstype = (int *)((long)_compresstype + 1)) {
  }
  iVar1 = strncmp((char *)_compresstype,"compress",8);
  if ((iVar1 == 0) || (iVar1 = strncmp((char *)_compresstype,"COMPRESS",8), iVar1 == 0)) {
    for (_compresstype = _compresstype + 2; (char)*_compresstype == ' ';
        _compresstype = (int *)((long)_compresstype + 1)) {
    }
    if (((char)*_compresstype == 'r') || ((char)*_compresstype == 'R')) {
      quantize_method = 0xb;
      while( true ) {
        bVar5 = false;
        if (((char)*_compresstype != ' ') && (bVar5 = false, (char)*_compresstype != ';')) {
          bVar5 = (char)*_compresstype != '\0';
        }
        if (!bVar5) break;
        _compresstype = (int *)((long)_compresstype + 1);
      }
    }
    else if (((char)*_compresstype == 'g') || ((char)*_compresstype == 'G')) {
      quantize_method = 0x15;
      while( true ) {
        bVar5 = false;
        if (((char)*_compresstype != ' ') && (bVar5 = false, (char)*_compresstype != ';')) {
          bVar5 = (char)*_compresstype != '\0';
        }
        if (!bVar5) break;
        _compresstype = (int *)((long)_compresstype + 1);
      }
    }
    else if (((char)*_compresstype == 'p') || ((char)*_compresstype == 'P')) {
      quantize_method = 0x1f;
      while( true ) {
        bVar5 = false;
        if (((char)*_compresstype != ' ') && (bVar5 = false, (char)*_compresstype != ';')) {
          bVar5 = (char)*_compresstype != '\0';
        }
        if (!bVar5) break;
        _compresstype = (int *)((long)_compresstype + 1);
      }
    }
    else if (((char)*_compresstype == 'h') || ((char)*_compresstype == 'H')) {
      quantize_method = 0x29;
      _compresstype = (int *)((long)_compresstype + 1);
      if ((*(char *)_compresstype == 's') || (*(char *)_compresstype == 'S')) {
        local_3c = 1;
      }
      while( true ) {
        bVar5 = false;
        if (((char)*_compresstype != ' ') && (bVar5 = false, (char)*_compresstype != ';')) {
          bVar5 = (char)*_compresstype != '\0';
        }
        if (!bVar5) break;
        _compresstype = (int *)((long)_compresstype + 1);
      }
    }
    for (; (char)*_compresstype == ' '; _compresstype = (int *)((long)_compresstype + 1)) {
    }
    smooth = 0;
    while (ppuVar2 = __ctype_b_loc(),
          ((*ppuVar2)[(int)(char)*_compresstype] & 0x800) != 0 && smooth < 9) {
      lVar3 = atol((char *)_compresstype);
      *(long *)(&scale + (long)smooth * 2) = lVar3;
      smooth = smooth + 1;
      while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)(char)*_compresstype] & 0x800) != 0) {
        _compresstype = (int *)((long)_compresstype + 1);
      }
      if ((char)*_compresstype == ',') {
        _compresstype = (int *)((long)_compresstype + 1);
      }
      for (; (char)*_compresstype == ' '; _compresstype = (int *)((long)_compresstype + 1)) {
      }
    }
    if ((char)*_compresstype == ';') {
      do {
        _compresstype = (int *)((long)_compresstype + 1);
      } while (*(char *)_compresstype == ' ');
      while ((char)*_compresstype != '\0') {
        if (((char)*_compresstype == 's') || ((char)*_compresstype == 'S')) {
          do {
            _compresstype = (int *)((long)_compresstype + 1);
          } while (*(char *)_compresstype == ' ');
          dVar6 = strtod((char *)_compresstype,(char **)&compresstype);
          local_80 = (float)dVar6;
          while( true ) {
            bVar5 = true;
            if ((char)*_compresstype != ' ') {
              bVar5 = (char)*_compresstype == ',';
            }
            if (!bVar5) break;
            _compresstype = (int *)((long)_compresstype + 1);
          }
        }
        else {
          if (((char)*_compresstype != 'q') && ((char)*_compresstype != 'Q')) {
            ptr1[0] = '}';
            ptr1[1] = '\0';
            ptr1[2] = '\0';
            ptr1[3] = '\0';
            return 0x7d;
          }
          piVar4 = (int *)((long)_compresstype + 1);
          if ((*(char *)piVar4 == 'z') || (*(char *)piVar4 == 'Z')) {
            local_40 = 2;
            piVar4 = (int *)((long)_compresstype + 2);
          }
          else if (*(char *)piVar4 == '0') {
            local_40 = -1;
            piVar4 = (int *)((long)_compresstype + 2);
          }
          while (_compresstype = piVar4, (char)*_compresstype == ' ') {
            piVar4 = (int *)((long)_compresstype + 1);
          }
          dVar6 = strtod((char *)_compresstype,(char **)&compresstype);
          local_7c = (float)dVar6;
          while( true ) {
            bVar5 = true;
            if ((char)*_compresstype != ' ') {
              bVar5 = (char)*_compresstype == ',';
            }
            if (!bVar5) break;
            _compresstype = (int *)((long)_compresstype + 1);
          }
        }
      }
    }
    fits_set_compression_type((fitsfile *)compspec_local,quantize_method,(int *)ptr1);
    fits_set_tile_dim((fitsfile *)compspec_local,6,(long *)&scale,(int *)ptr1);
    if (quantize_method == 0x29) {
      fits_set_hcomp_scale((fitsfile *)compspec_local,local_80,(int *)ptr1);
      fits_set_hcomp_smooth((fitsfile *)compspec_local,local_3c,(int *)ptr1);
    }
    if ((local_7c != -99.0) || (NAN(local_7c))) {
      fits_set_quantize_level((fitsfile *)compspec_local,local_7c,(int *)ptr1);
      fits_set_quantize_method((fitsfile *)compspec_local,local_40,(int *)ptr1);
    }
    fptr_local._4_4_ = *(int *)ptr1;
  }
  else {
    ptr1[0] = '}';
    ptr1[1] = '\0';
    ptr1[2] = '\0';
    ptr1[3] = '\0';
    fptr_local._4_4_ = 0x7d;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffparsecompspec(fitsfile *fptr,  /* I - FITS file pointer               */
           char *compspec,     /* I - image compression specification */
           int *status)          /* IO - error status                       */
/*
  Parse the image compression specification that was give in square brackets
  following the output FITS file name, as in these examples:

    myfile.fits[compress]  - default Rice compression, row by row 
    myfile.fits[compress TYPE] -  the first letter of TYPE defines the
                                  compression algorithm:
                                   R = Rice
                                   G = GZIP
                                   H = HCOMPRESS
                                   HS = HCOMPRESS (with smoothing)
				   B - BZIP2
                                   P = PLIO

    myfile.fits[compress TYPE 100,100] - the numbers give the dimensions
                                         of the compression tiles.  Default
                                         is NAXIS1, 1, 1, ...

       other optional parameters may be specified following a semi-colon 
       
    myfile.fits[compress; q 8.0]          q specifies the floating point 
    mufile.fits[compress TYPE; q -.0002]        quantization level;
    myfile.fits[compress TYPE 100,100; q 10, s 25]  s specifies the HCOMPRESS
                                                     integer scaling parameter

The compression parameters are saved in the fptr->Fptr structure for use
when writing FITS images.

*/
{
    char *ptr1;

    /* initialize with default values */
    int ii, compresstype = RICE_1, smooth = 0;
    int quantize_method = SUBTRACTIVE_DITHER_1;
    long tilesize[MAX_COMPRESS_DIM] = {0,0,0,0,0,0};
    float qlevel = -99., scale = 0.;
    
    ptr1 = compspec;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    if (strncmp(ptr1, "compress", 8) && strncmp(ptr1, "COMPRESS", 8) )
    {
       /* apparently this string does not specify compression parameters */
       return(*status = URL_PARSE_ERROR);
    }

    ptr1 += 8;
    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    /* ========================= */
    /* look for compression type */
    /* ========================= */

    if (*ptr1 == 'r' || *ptr1 == 'R')
    {
        compresstype = RICE_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'g' || *ptr1 == 'G')
    {
        compresstype = GZIP_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
/*
    else if (*ptr1 == 'b' || *ptr1 == 'B')
    {
        compresstype = BZIP2_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;

    }
*/
    else if (*ptr1 == 'p' || *ptr1 == 'P')
    {
        compresstype = PLIO_1;
        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }
    else if (*ptr1 == 'h' || *ptr1 == 'H')
    {
        compresstype = HCOMPRESS_1;
        ptr1++;
        if (*ptr1 == 's' || *ptr1 == 'S')
           smooth = 1;  /* apply smoothing when uncompressing HCOMPRESSed image */

        while (*ptr1 != ' ' && *ptr1 != ';' && *ptr1 != '\0') 
           ptr1++;
    }

    /* ======================== */
    /* look for tile dimensions */
    /* ======================== */

    while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

    ii = 0;
    while (isdigit( (int) *ptr1) && ii < 9)
    {
       tilesize[ii] = atol(ptr1);  /* read the integer value */
       ii++;

       while (isdigit((int) *ptr1))    /* skip over the integer */
           ptr1++;

       if (*ptr1 == ',')
           ptr1++;   /* skip over the comma */
          
       while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;
    }

    /* ========================================================= */
    /* look for semi-colon, followed by other optional parameters */
    /* ========================================================= */

    if (*ptr1 == ';') {
        ptr1++;
        while (*ptr1 == ' ')    /* ignore leading blanks */
           ptr1++;

          while (*ptr1 != 0) {  /* haven't reached end of string yet */

              if (*ptr1 == 's' || *ptr1 == 'S') {
                  /* this should be the HCOMPRESS "scale" parameter; default = 1 */
	   
                  ptr1++;
                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  scale = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else if (*ptr1 == 'q' || *ptr1 == 'Q') {
                /* this should be the floating point quantization parameter */

                  ptr1++;
                  if (*ptr1 == 'z' || *ptr1 == 'Z') {
                      /* use the subtractive_dither_2 option */
                      quantize_method = SUBTRACTIVE_DITHER_2;
                      ptr1++;
		  } else if (*ptr1 == '0') {
                      /* do not dither */
                      quantize_method = NO_DITHER;
                      ptr1++;
		  }

                  while (*ptr1 == ' ')    /* ignore leading blanks */
                      ptr1++;

                  qlevel = (float) strtod(ptr1, &ptr1);

                  while (*ptr1 == ' ' || *ptr1 == ',') /* skip over blanks or comma */
                     ptr1++;

            } else {
                return(*status = URL_PARSE_ERROR);
            }
        }
    }

    /* ================================= */
    /* finished parsing; save the values */
    /* ================================= */

    fits_set_compression_type(fptr, compresstype, status);
    fits_set_tile_dim(fptr, MAX_COMPRESS_DIM, tilesize, status);
 
    if (compresstype == HCOMPRESS_1) {
        fits_set_hcomp_scale (fptr, scale,  status);
        fits_set_hcomp_smooth(fptr, smooth, status);
    }

    if (qlevel != -99.) {
        fits_set_quantize_level(fptr, qlevel, status);
        fits_set_quantize_method(fptr, quantize_method, status);
    }

    return(*status);
}